

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::PlaTask::~PlaTask(PlaTask *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~PlaTask((PlaTask *)0xb3f188);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

PlaTask(KnownSystemName knownNameId) : SystemTaskBase(knownNameId) {}